

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::add_failed_bytes(torrent *this,int b)

{
  long lVar1;
  long lVar2;
  int b_local;
  torrent *this_local;
  
  lVar2 = this->m_total_failed_bytes;
  lVar1 = ::std::numeric_limits<long>::max();
  if (lVar1 - b < lVar2) {
    lVar2 = ::std::numeric_limits<long>::max();
    this->m_total_failed_bytes = lVar2;
  }
  else {
    this->m_total_failed_bytes = (long)b + this->m_total_failed_bytes;
  }
  counters::inc_stats_counter(this->m_stats_counters,0x87,(long)b);
  return;
}

Assistant:

void torrent::add_failed_bytes(int const b)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(b > 0);
		if (m_total_failed_bytes <= std::numeric_limits<std::int64_t>::max() - b)
			m_total_failed_bytes += b;
		else
			m_total_failed_bytes = std::numeric_limits<std::int64_t>::max();

		// the stats counters are 64 bits, so we don't check for overflow there
		m_stats_counters.inc_stats_counter(counters::recv_failed_bytes, b);
	}